

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

int helicsInputGetStringSize(HelicsInput inp)

{
  Input *this;
  size_t sVar1;
  InputObject *inpObj;
  HelicsError *in_stack_ffffffffffffffd0;
  HelicsInput in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  this = (Input *)anon_unknown.dwarf_5d1c2::verifyInput
                            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (this == (Input *)0x0) {
    local_4 = 0;
  }
  else {
    sVar1 = helics::Input::getStringSize(this);
    local_4 = (int)sVar1 + 1;
  }
  return local_4;
}

Assistant:

int helicsInputGetStringSize(HelicsInput inp)
{
    auto* inpObj = verifyInput(inp, nullptr);
    if (inpObj == nullptr) {
        return 0;
    }
    try {
        return static_cast<int>(inpObj->inputPtr->getStringSize()) + 1;
    }
    // LCOV_EXCL_START
    catch (...) {
        return 0;
    }
    // LCOV_EXCL_STOP
}